

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void lj_trace_hot(jit_State *J,BCIns *pc)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *(short *)((long)&J[1].cur.nextgc.gcptr64 + (ulong)((uint)((ulong)pc >> 1) & 0x7e)) =
       (short)J->param[6] * 2;
  if ((J->state == LJ_TRACE_IDLE) && ((J[-1].penalty[0x2c].pc.ptr64 & 0x6000) == 0)) {
    J->parent = 0;
    J->exitno = 0;
    J->state = LJ_TRACE_START;
    lj_trace_ins(J,pc + -1);
  }
  *piVar2 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_trace_hot(jit_State *J, const BCIns *pc)
{
  /* Note: pc is the interpreter bytecode PC here. It's offset by 1. */
  ERRNO_SAVE
  /* Reset hotcount. */
  hotcount_set(J2GG(J), pc, J->param[JIT_P_hotloop]*HOTCOUNT_LOOP);
  /* Only start a new trace if not recording or inside __gc call or vmevent. */
  if (J->state == LJ_TRACE_IDLE &&
      !(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT))) {
    J->parent = 0;  /* Root trace. */
    J->exitno = 0;
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc-1);
  }
  ERRNO_RESTORE
}